

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_exception_bkpt_insn_arm(CPUARMState *env,uint32_t syndrome)

{
  uint uVar1;
  uint32_t target_el;
  uint32_t uVar2;
  
  uVar1 = arm_debug_target_el(env);
  target_el = arm_current_el(env);
  uVar2 = arm_debug_exception_fsr(env);
  (env->exception).fsr = uVar2;
  (env->exception).vaddress = 0;
  if (target_el < uVar1) {
    target_el = uVar1;
  }
  raise_exception_arm(env,7,syndrome,target_el);
}

Assistant:

void HELPER(exception_bkpt_insn)(CPUARMState *env, uint32_t syndrome)
{
    int debug_el = arm_debug_target_el(env);
    int cur_el = arm_current_el(env);

    /* FSR will only be used if the debug target EL is AArch32. */
    env->exception.fsr = arm_debug_exception_fsr(env);
    /* FAR is UNKNOWN: clear vaddress to avoid potentially exposing
     * values to the guest that it shouldn't be able to see at its
     * exception/security level.
     */
    env->exception.vaddress = 0;
    /*
     * Other kinds of architectural debug exception are ignored if
     * they target an exception level below the current one (in QEMU
     * this is checked by arm_generate_debug_exceptions()). Breakpoint
     * instructions are special because they always generate an exception
     * to somewhere: if they can't go to the configured debug exception
     * level they are taken to the current exception level.
     */
    if (debug_el < cur_el) {
        debug_el = cur_el;
    }
    raise_exception(env, EXCP_BKPT, syndrome, debug_el);
}